

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::date_t,duckdb::date_t>
          (BaseAppender *this,Vector *col,date_t input)

{
  date_t dVar1;
  
  dVar1 = Cast::Operation<duckdb::date_t,duckdb::date_t>(input);
  *(int32_t *)(col->data + (this->chunk).count * 4) = dVar1.days;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}